

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

url_mapper * __thiscall
cppcms::url_mapper::data::child(data *this,string_key *name,string_key *full_url)

{
  entry *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  url_mapper *puVar2;
  string_key *in_stack_000000c8;
  size_t in_stack_000000d0;
  string_key *in_stack_000000d8;
  data *in_stack_000000e0;
  entry *fmt;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string_key *in_stack_ffffffffffffff38;
  
  peVar1 = get_entry(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  if (peVar1->child == (application *)0x0) {
    uVar3 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    string_key::str_abi_cxx11_(in_stack_ffffffffffffff38);
    std::operator+((char *)CONCAT17(uVar3,in_stack_ffffffffffffff08),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff08),(char *)__rhs);
    string_key::str_abi_cxx11_(in_stack_ffffffffffffff38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff08),(char *)__rhs);
    cppcms_error::cppcms_error((cppcms_error *)__rhs,in_stack_fffffffffffffef8);
    __cxa_throw(__rhs,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  puVar2 = application::mapper((application *)0x3bdb6a);
  return puVar2;
}

Assistant:

url_mapper &child(string_key const &name,string_key const &full_url)
		{
			entry const &fmt = get_entry(name,1,full_url);
			if(!fmt.child) {
				throw cppcms_error("url_mapper: the key " + name.str() + " is not child application key"
						" in url `" + full_url.str() + "'");
			}
			return fmt.child->mapper();
		}